

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadAddress
          (BinaryReader *this,Address *out_value,Index memory,char *desc)

{
  Offset *pOVar1;
  pointer pLVar2;
  uint8_t *puVar3;
  Result RVar4;
  undefined8 in_RAX;
  size_t sVar5;
  undefined4 in_register_00000014;
  uint32_t val;
  
  val = (uint32_t)((ulong)in_RAX >> 0x20);
  pLVar2 = (this->memories).super__Vector_base<wabt::Limits,_std::allocator<wabt::Limits>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->memories).super__Vector_base<wabt::Limits,_std::allocator<wabt::Limits>_>._M_impl.
      super__Vector_impl_data._M_finish == pLVar2) {
    PrintError(this,"load/store memory %u out of range %lu",0,0);
  }
  else {
    if (pLVar2->is_64 != true) {
      RVar4 = ReadU32Leb128(this,&val,(char *)CONCAT44(in_register_00000014,memory));
      *out_value = (ulong)val;
      return (Result)RVar4.enum_;
    }
    puVar3 = (this->state_).data;
    sVar5 = ReadU64Leb128(puVar3 + (this->state_).offset,puVar3 + this->read_end_,out_value);
    if (sVar5 != 0) {
      pOVar1 = &(this->state_).offset;
      *pOVar1 = *pOVar1 + sVar5;
      return (Result)Ok;
    }
    PrintError(this,"unable to read u64 leb128: %s",(char *)CONCAT44(in_register_00000014,memory));
  }
  return (Result)Error;
}

Assistant:

Result BinaryReader::ReadAddress(Address* out_value,
                                 Index memory,
                                 const char* desc) {
  ERROR_UNLESS(memory < memories.size(),
               "load/store memory %u out of range %lu", memory,
               memories.size());
  if (memories[memory].is_64) {
    return ReadU64Leb128(out_value, desc);
  } else {
    uint32_t val;
    Result res = ReadU32Leb128(&val, desc);
    *out_value = val;
    return res;
  }
}